

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_all_gej(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  int iVar1;
  secp256k1_gej *in_RDX;
  long in_RSI;
  void *in_RDI;
  secp256k1_fe *unaff_retaddr;
  size_t i;
  secp256k1_fe u;
  secp256k1_fe *in_stack_ffffffffffffffa8;
  secp256k1_gej *psVar2;
  undefined1 local_48 [48];
  secp256k1_gej *local_18;
  long local_10;
  void *local_8;
  
  psVar2 = (secp256k1_gej *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_18 <= psVar2) {
      if (local_18 != (secp256k1_gej *)0x0) {
        memcpy(local_8,(void *)(local_10 + 0x60),0x30);
        for (psVar2 = (secp256k1_gej *)0x1; psVar2 < local_18;
            psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1)) {
          secp256k1_fe_mul(&psVar2->x,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x12950f);
        }
        secp256k1_fe_inv(&psVar2->x,in_stack_ffffffffffffffa8);
        psVar2 = local_18;
        while (psVar2 = (secp256k1_gej *)&psVar2[-1].field_0x97, psVar2 != (secp256k1_gej *)0x0) {
          secp256k1_fe_mul((secp256k1_fe *)psVar2,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x129581
                          );
          secp256k1_fe_mul(&psVar2->x,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x1295a3);
        }
        memcpy(local_8,local_48,0x30);
        for (psVar2 = (secp256k1_gej *)0x0; psVar2 < local_18;
            psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1)) {
          secp256k1_ge_set_gej_zinv((secp256k1_ge *)u.n[0],(secp256k1_gej *)i,unaff_retaddr);
        }
        for (psVar2 = (secp256k1_gej *)0x0; psVar2 < local_18;
            psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1)) {
          secp256k1_ge_verify((secp256k1_ge *)psVar2);
        }
      }
      return;
    }
    secp256k1_gej_verify(psVar2);
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x129438);
    if (iVar1 != 0) break;
    psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1);
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/group_impl.h"
          ,0xcc,"test condition failed: !secp256k1_gej_is_infinity(&a[i])");
  abort();
}

Assistant:

static void secp256k1_ge_set_all_gej(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
        VERIFY_CHECK(!secp256k1_gej_is_infinity(&a[i]));
    }
#endif

    if (len == 0) {
        return;
    }

    /* Use destination's x coordinates as scratch space */
    r[0].x = a[0].z;
    for (i = 1; i < len; i++) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &a[i].z);
    }
    secp256k1_fe_inv(&u, &r[len - 1].x);

    for (i = len - 1; i > 0; i--) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &u);
        secp256k1_fe_mul(&u, &u, &a[i].z);
    }
    r[0].x = u;

    for (i = 0; i < len; i++) {
        secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}